

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_>::hex_writer>
             *this,wchar_t **it)

{
  size_t sVar1;
  int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *piVar2;
  hex_writer *in_RSI;
  basic_string_view<char> *in_RDI;
  wchar_t *unaff_retaddr;
  char *in_stack_00000008;
  basic_string_view<char> *__result;
  
  __result = in_RDI;
  sVar1 = basic_string_view<char>::size(in_RDI);
  if (sVar1 != 0) {
    basic_string_view<char>::data(in_RDI);
    basic_string_view<char>::size(in_RDI);
    piVar2 = (int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *)
             std::copy_n<char_const*,unsigned_long,wchar_t*>
                       (in_stack_00000008,(unsigned_long)unaff_retaddr,(wchar_t *)__result);
    in_RSI->self = piVar2;
  }
  piVar2 = (int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *)
           std::fill_n<wchar_t*,unsigned_long,wchar_t>
                     (unaff_retaddr,(unsigned_long)__result,(wchar_t *)in_RSI);
  in_RSI->self = piVar2;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
            (in_RSI,(wchar_t **)in_RDI);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }